

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileUtil.h
# Opt level: O2

void FileUtil::readMetaData
               (string *data_folder,int *user_num,int *item_num,int *train_rating_num,
               int *test_rating_num,string *train_path,string *test_path)

{
  ulonglong uVar1;
  ostream *poVar2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  par;
  string line;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e0;
  is_any_ofF<char> local_2c0;
  is_any_ofF<char> local_2a8;
  is_any_ofF<char> local_290;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_278;
  string meta_path;
  ifstream data_file;
  int aiStack_218 [122];
  
  std::operator+(&meta_path,data_folder,"/meta");
  std::ifstream::ifstream(&data_file,meta_path._M_dataplus._M_p,_S_in);
  if (*(int *)((long)aiStack_218 + *(long *)(_data_file + -0x18)) == 0) {
    line._M_dataplus._M_p = (pointer)&line.field_2;
    line._M_string_length = 0;
    line.field_2._M_local_buf[0] = '\0';
    std::getline<char,std::char_traits<char>,std::allocator<char>>
              ((istream *)&data_file,(string *)&line);
    par.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    par.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    par.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    boost::algorithm::is_any_of<char[2]>(&local_290,(char (*) [2])0x13b453);
    boost::algorithm::
    split<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::__cxx11::string&,boost::algorithm::detail::is_any_ofF<char>>
              (&par,&line,&local_290,token_compress_off);
    boost::algorithm::detail::is_any_ofF<char>::~is_any_ofF(&local_290);
    uVar1 = strtoull(((par.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p,(char **)0x0,0)
    ;
    *user_num = (int)uVar1;
    uVar1 = strtoull(par.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[1]._M_dataplus._M_p,(char **)0x0,0);
    *item_num = (int)uVar1;
    std::getline<char,std::char_traits<char>,std::allocator<char>>
              ((istream *)&data_file,(string *)&line);
    boost::algorithm::is_any_of<char[2]>(&local_2a8,(char (*) [2])0x13b453);
    boost::algorithm::
    split<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::__cxx11::string&,boost::algorithm::detail::is_any_ofF<char>>
              (&par,&line,&local_2a8,token_compress_off);
    boost::algorithm::detail::is_any_ofF<char>::~is_any_ofF(&local_2a8);
    uVar1 = strtoull(((par.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p,(char **)0x0,0)
    ;
    *train_rating_num = (int)uVar1;
    std::operator+(&local_2e0,data_folder,"/");
    std::operator+(&local_278,&local_2e0,
                   par.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + 1);
    std::__cxx11::string::operator=((string *)train_path,(string *)&local_278);
    std::__cxx11::string::~string((string *)&local_278);
    std::__cxx11::string::~string((string *)&local_2e0);
    std::getline<char,std::char_traits<char>,std::allocator<char>>
              ((istream *)&data_file,(string *)&line);
    boost::algorithm::is_any_of<char[2]>(&local_2c0,(char (*) [2])0x13b453);
    boost::algorithm::
    split<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::__cxx11::string&,boost::algorithm::detail::is_any_ofF<char>>
              (&par,&line,&local_2c0,token_compress_off);
    boost::algorithm::detail::is_any_ofF<char>::~is_any_ofF(&local_2c0);
    uVar1 = strtoull(((par.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p,(char **)0x0,0)
    ;
    *test_rating_num = (int)uVar1;
    std::operator+(&local_2e0,data_folder,"/");
    std::operator+(&local_278,&local_2e0,
                   par.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + 1);
    std::__cxx11::string::operator=((string *)test_path,(string *)&local_278);
    std::__cxx11::string::~string((string *)&local_278);
    std::__cxx11::string::~string((string *)&local_2e0);
    std::ifstream::close();
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&par);
    std::__cxx11::string::~string((string *)&line);
    std::ifstream::~ifstream(&data_file);
    std::__cxx11::string::~string((string *)&meta_path);
    return;
  }
  poVar2 = std::operator<<((ostream *)&std::cerr,"cannot open ");
  poVar2 = std::operator<<(poVar2,(string *)&meta_path);
  std::endl<char,std::char_traits<char>>(poVar2);
  exit(1);
}

Assistant:

void readMetaData(string data_folder, int &user_num, int &item_num, int &train_rating_num,
                      int &test_rating_num, string &train_path, string &test_path) {

        string meta_path = data_folder + "/meta";

        ifstream data_file(meta_path.c_str());

        if(!data_file.good()){
            cerr << "cannot open " << meta_path << endl;
            exit(1);
        }

        string line;
        std::getline(data_file, line);
        vector<string> par;
        boost::split(par, line, boost::is_any_of(" "));

        user_num = strtoull(par[0].c_str(), nullptr, 0);
        item_num = strtoull(par[1].c_str(), nullptr, 0);

        std::getline(data_file, line);
        boost::split(par, line, boost::is_any_of(" "));
        train_rating_num = strtoull(par[0].c_str(), nullptr, 0);
        train_path = data_folder + "/" + par[1];

        std::getline(data_file, line);
        boost::split(par, line, boost::is_any_of(" "));
        test_rating_num = strtoull(par[0].c_str(), nullptr, 0);
        test_path = data_folder + "/" + par[1];

        data_file.close();
    }